

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool benchmark<ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *fnameSessions)

{
  int iVar1;
  bool bVar2;
  int32_t iVar3;
  size_type sVar4;
  undefined8 uVar5;
  uint64_t uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  ImDrawListSharedData *in_stack_00000008;
  vector<ImDrawList,_std::allocator<ImDrawList>_> *in_stack_00000010;
  ImDrawData *in_stack_00000018;
  int32_t in_stack_00000024;
  uint64_t compressedSize_bytes;
  XorRlePerDrawListWithVtxOffset compressor;
  vector<ImDrawList,_std::allocator<ImDrawList>_> drawLists;
  ImDrawData drawData;
  int fid;
  Session session;
  value_type *fname;
  int i;
  char *in_stack_00000170;
  Session *in_stack_00000178;
  undefined2 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef2;
  undefined1 in_stack_fffffffffffffef3;
  uint in_stack_fffffffffffffef4;
  vector<ImDrawList,_std::allocator<ImDrawList>_> *this;
  XorRlePerDrawListWithVtxOffset *in_stack_ffffffffffffff10;
  uint local_44;
  vector<ImDrawList,_std::allocator<ImDrawList>_> local_30;
  const_reference local_18;
  int local_c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_8;
  undefined1 auVar9 [16];
  
  local_8 = in_RDI;
  printf("[+] Running benchmark for compressor \'%s\'\n","XorRlePerDrawListWithVtxOffset");
  local_c = 0;
  do {
    iVar1 = local_c;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_8);
    if ((int)sVar4 <= iVar1) {
      return true;
    }
    local_18 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_8,(long)local_c);
    uVar5 = std::__cxx11::string::c_str();
    printf("[+] Processing session \'%s\' ...\n",uVar5);
    this = &local_30;
    Session::Session((Session *)0x1084b3);
    std::__cxx11::string::c_str();
    bVar2 = Session::load(in_stack_00000178,in_stack_00000170);
    if (bVar2) {
      local_44 = 0;
      ImDrawData::ImDrawData
                ((ImDrawData *)
                 CONCAT44(in_stack_fffffffffffffef4,
                          CONCAT13(in_stack_fffffffffffffef3,
                                   CONCAT12(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0))));
      std::vector<ImDrawList,_std::allocator<ImDrawList>_>::vector
                ((vector<ImDrawList,_std::allocator<ImDrawList>_> *)0x108549);
      ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::XorRlePerDrawListWithVtxOffset
                (in_stack_ffffffffffffff10);
      in_stack_ffffffffffffff10 = (XorRlePerDrawListWithVtxOffset *)0x0;
      while( true ) {
        in_stack_fffffffffffffef4 = local_44;
        ImGui::GetDrawListSharedData();
        in_stack_fffffffffffffef3 =
             Session::getFrame((Session *)compressedSize_bytes,in_stack_00000024,in_stack_00000018,
                               in_stack_00000010,in_stack_00000008);
        if (!(bool)in_stack_fffffffffffffef3) break;
        in_stack_fffffffffffffef2 =
             ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::setDrawData
                       ((XorRlePerDrawListWithVtxOffset *)compressor.super_Interface._vptr_Interface
                        ,(ImDrawData *)compressedSize_bytes);
        if (!(bool)in_stack_fffffffffffffef2) {
          fprintf(_stderr,"    [E] Failed setting draw data for frame %d\n",(ulong)local_44);
          break;
        }
        uVar6 = ImDrawDataCompressor::Interface::diffSize
                          (&in_stack_ffffffffffffff10->super_Interface);
        in_stack_ffffffffffffff10 =
             (XorRlePerDrawListWithVtxOffset *)
             ((long)&(in_stack_ffffffffffffff10->super_Interface)._vptr_Interface + uVar6);
        local_44 = local_44 + 1;
      }
      printf("    - Compressed size   = %d bytes\n",(ulong)in_stack_ffffffffffffff10 & 0xffffffff);
      uVar6 = Session::totalSize_bytes((Session *)in_stack_ffffffffffffff10);
      auVar8._8_4_ = (int)(uVar6 >> 0x20);
      auVar8._0_8_ = uVar6;
      auVar8._12_4_ = 0x45300000;
      auVar10._8_4_ = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
      auVar10._0_8_ = in_stack_ffffffffffffff10;
      auVar10._12_4_ = 0x45300000;
      printf("    - Compression ratio = %6.4f times\n",
             ((auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) /
             ((auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)in_stack_ffffffffffffff10) - 4503599627370496.0)));
      auVar9._8_4_ = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
      auVar9._0_8_ = in_stack_ffffffffffffff10;
      auVar9._12_4_ = 0x45300000;
      uVar7 = SUB84(in_stack_ffffffffffffff10,0);
      iVar3 = Session::nFrames((Session *)0x108716);
      printf("    - Average bandwidth = %6.4f kB/s (at 60.0 fps)\n",
             ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar7) - 4503599627370496.0)) * 0.0009765625 *
             (60.0 / (double)iVar3));
      printf("\n");
      ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::~XorRlePerDrawListWithVtxOffset
                ((XorRlePerDrawListWithVtxOffset *)
                 CONCAT44(in_stack_fffffffffffffef4,
                          CONCAT13(in_stack_fffffffffffffef3,
                                   CONCAT12(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0))));
      std::vector<ImDrawList,_std::allocator<ImDrawList>_>::~vector(this);
    }
    else {
      fprintf(_stderr,"    [E] Failed reading the file. Probably not an ImDrawData session file?\n")
      ;
    }
    Session::~Session((Session *)0x10877e);
    local_c = local_c + 1;
  } while( true );
}

Assistant:

bool benchmark(const std::vector<std::string> & fnameSessions) {
    printf("[+] Running benchmark for compressor '%s'\n", T::kName);

    for (int i = 0; i < (int) fnameSessions.size(); ++i) {
        auto & fname = fnameSessions[i];

        printf("[+] Processing session '%s' ...\n", fname.c_str());

        Session session;
        if (session.load(fname.c_str()) == false) {
            fprintf(stderr, "    [E] Failed reading the file. Probably not an ImDrawData session file?\n");
            continue;
        }

        int fid = 0;
        ImDrawData drawData;
        std::vector<ImDrawList> drawLists;

        T compressor;
        uint64_t compressedSize_bytes = 0;
        while (session.getFrame(fid, &drawData, drawLists, ImGui::GetDrawListSharedData())) {
            if (compressor.setDrawData(&drawData) == false) {
                fprintf(stderr, "    [E] Failed setting draw data for frame %d\n", fid);
                break;
            }

            compressedSize_bytes += compressor.diffSize();

            ++fid;
        }

        printf("    - Compressed size   = %d bytes\n", (int) compressedSize_bytes);
        printf("    - Compression ratio = %6.4f times\n", ((double)(session.totalSize_bytes()))/compressedSize_bytes);
        printf("    - Average bandwidth = %6.4f kB/s (at 60.0 fps)\n", ((double)(compressedSize_bytes))/1024.0*(60.0/session.nFrames()));
        printf("\n");
    }

    return true;
}